

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Argument::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Argument *this,PatternList *left)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *ppVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  unsigned_long uVar7;
  long lVar8;
  pointer psVar9;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *local_40;
  undefined1 local_31;
  
  __return_storage_ptr__->first = 0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar8 = (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_40 = __return_storage_ptr__;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 4;
    psVar9 = (left->
             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar7 = 0;
    do {
      peVar1 = (psVar9->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        lVar6 = 0;
      }
      else {
        lVar6 = __dynamic_cast(peVar1,&Pattern::typeinfo,&typeinfo,0);
      }
      ppVar4 = local_40;
      if (lVar6 != 0) {
        local_40->first = uVar7;
        iVar5 = (*(this->super_LeafPattern).super_Pattern._vptr_Pattern[3])();
        local_58 = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::Argument,std::allocator<docopt::Argument>,std::__cxx11::string_const&,docopt::value_const&>
                  (a_Stack_50,(Argument **)&local_58,(allocator<docopt::Argument> *)&local_31,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar5),(value *)(lVar6 + 0x28));
        _Var3._M_pi = a_Stack_50[0]._M_pi;
        peVar2 = local_58;
        local_58 = (element_type *)0x0;
        a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (ppVar4->second).
                  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (ppVar4->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = peVar2;
        (ppVar4->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var3._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (a_Stack_50[0]._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return local_40;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
        return local_40;
      }
      uVar7 = uVar7 + 1;
      psVar9 = psVar9 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != uVar7);
  }
  return local_40;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Argument::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				ret.first = i;
				ret.second = std::make_shared<Argument>(name(), arg->getValue());
				break;
			}
		}

		return ret;
	}